

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

void __thiscall
bgui::ImageAdapter<unsigned_char>::ImageAdapter
          (ImageAdapter<unsigned_char> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im,double valid_min,
          double valid_max,bool delete_on_close)

{
  ImageAdapterBase::ImageAdapterBase(&this->super_ImageAdapterBase);
  (this->super_ImageAdapterBase)._vptr_ImageAdapterBase = (_func_int **)&PTR__ImageAdapter_001227a0;
  (this->mipmap).
  super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mipmap).
  super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mipmap).
  super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->image = im;
  this->del = delete_on_close;
  this->vmin = valid_min;
  this->vmax = valid_max;
  adaptMinMaxIntensity(this,0,0,im->width,im->height);
  return;
}

Assistant:

ImageAdapter(const gimage::Image<T> *im, double valid_min=-std::numeric_limits<float>::max(),
                 double valid_max=std::numeric_limits<float>::max(), bool delete_on_close=false)
    {
      image=im;
      del=delete_on_close;

      vmin=valid_min;
      vmax=valid_max;

      adaptMinMaxIntensity(0, 0, image->getWidth(), image->getHeight());
    }